

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

DescriptorProto_ReservedRange * __thiscall
google::protobuf::DescriptorProto_ReservedRange::New
          (DescriptorProto_ReservedRange *this,Arena *arena)

{
  DescriptorProto_ReservedRange *this_00;
  DescriptorProto_ReservedRange *n;
  Arena *arena_local;
  DescriptorProto_ReservedRange *this_local;
  
  this_00 = (DescriptorProto_ReservedRange *)operator_new(0x20);
  DescriptorProto_ReservedRange(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::DescriptorProto_ReservedRange>(arena,this_00);
  }
  return this_00;
}

Assistant:

DescriptorProto_ReservedRange* DescriptorProto_ReservedRange::New(::google::protobuf::Arena* arena) const {
  DescriptorProto_ReservedRange* n = new DescriptorProto_ReservedRange;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}